

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

int graph_5_4::bfs_1(m_graph g)

{
  undefined4 *puVar1;
  
  puVar1 = &visited;
  do {
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  } while( true );
}

Assistant:

int bfs_2(m_graph g) {
        for (int i = 0; i < g.vnum; i++)
            visited[i] = 0;
//        InitQueue(Q);
//        for (int j = 0; j < g.vnum; j++) {
//            if (visited[j] == 0) {
//                visited[j] = 1;
//                visit;
//                EnQueue(Q, j);
//                while (!isEmptyQueue(Q)) {
//                    DeQueue(Q, j);
//                    for (int i = 0; i < g.vnum; i++) {
//                        if (visited[i] == 0 && g.arc[j][i] == 1) {
//                            visited[i] = 1;
//                            visit;
//                            EnQueu(Q, i);
//                        }
//                    }
//                }
//            }
//        }
    }